

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O1

int setup_decode_folder(archive_read *a,_7z_folder *folder,int header)

{
  uint uVar1;
  _7zip *zip;
  void *__ptr;
  ulong uVar2;
  unsigned_long uVar3;
  size_t sVar4;
  bool bVar5;
  int iVar6;
  uint64_t uVar7;
  size_t *psVar8;
  ssize_t sVar9;
  size_t __n;
  uchar *puVar10;
  _7z_coder *coder2;
  char *fmt;
  _7z_coder *coder1;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  _7z_coder *p_Var15;
  char *pcVar16;
  uchar *b [3];
  int idx [3];
  void *buff;
  size_t s [3];
  _7z_coder *scoder [3];
  void *local_d8 [3];
  archive_read *local_c0;
  int local_b8 [4];
  _7z_coder *local_a8;
  _7z_coder *local_a0;
  void *local_98;
  void *local_90;
  size_t local_88 [4];
  undefined8 local_68;
  uint64_t uStack_60;
  uint64_t local_58;
  _7z_coder *local_48 [3];
  
  zip = (_7zip *)a->format->data;
  lVar11 = 0x9c6;
  do {
    __ptr = (void *)(&(zip->si).pi.pos)[lVar11];
    if (__ptr != (void *)0x0) {
      free(__ptr);
    }
    (&(zip->si).pi.pos)[lVar11] = 0;
    lVar11 = lVar11 + 1;
  } while (lVar11 != 0x9c9);
  pcVar16 = "archive header";
  if (header == 0) {
    pcVar16 = "file content";
  }
  uVar1 = (uint)folder->numPackedStreams;
  zip->pack_stream_remaining = uVar1;
  zip->pack_stream_index = folder->packIndex;
  uVar7 = folder_uncompressed_size(folder);
  zip->folder_outbytes_remaining = uVar7;
  zip->uncompressed_buffer_bytes_remaining = 0;
  uVar2 = folder->numCoders;
  if (uVar2 == 0) {
    iVar14 = 0;
  }
  else {
    uVar13 = 0;
    uVar12 = 1;
    iVar14 = 0;
    do {
      uVar3 = folder->coders[uVar13].codec;
      if ((long)uVar3 < 0x6f10101) {
        if (uVar3 == 0x303011b) {
          iVar14 = iVar14 + 1;
        }
      }
      else if (((uVar3 == 0x6f10101) || (uVar3 == 0x6f10701)) || (uVar3 == 0x6f10303)) {
        zip->has_encrypted_entries = 1;
        if (a->entry != (archive_entry *)0x0) {
          archive_entry_set_is_data_encrypted(a->entry,'\x01');
          archive_entry_set_is_metadata_encrypted(a->entry,'\x01');
        }
        fmt = "The %s is encrypted, but currently not supported";
        goto LAB_00499baf;
      }
      uVar13 = (ulong)uVar12;
      uVar12 = uVar12 + 1;
    } while (uVar13 < uVar2);
  }
  if (zip->has_encrypted_entries == -1) {
    zip->has_encrypted_entries = 0;
  }
  if (1 < iVar14 || iVar14 == 0 && 2 < uVar2) {
    fmt = "The %s is encoded with many filters, but currently not supported";
LAB_00499baf:
    archive_set_error(&a->archive,-1,fmt,pcVar16);
    return -0x1e;
  }
  coder1 = folder->coders;
  p_Var15 = coder1 + 1;
  coder2 = (_7z_coder *)0x0;
  if (uVar2 == 2) {
    coder2 = p_Var15;
  }
  if (iVar14 == 0) goto LAB_00499fb3;
  local_48[2] = &setup_decode_folder::coder_copy;
  local_48[0] = &setup_decode_folder::coder_copy;
  local_48[1] = &setup_decode_folder::coder_copy;
  local_d8[2] = (void *)0x0;
  local_d8[0] = (void *)0x0;
  local_d8[1] = (void *)0x0;
  local_68._0_4_ = 0xffffffff;
  local_68._4_4_ = 0xffffffff;
  uStack_60 = 0xffffffffffffffff;
  local_58 = 0xffffffffffffffff;
  local_88[2] = 0;
  local_88[0] = 0;
  local_88[1] = 0;
  local_b8[0] = 0;
  local_b8[1] = 1;
  local_b8[2] = 2;
  local_a8 = coder2;
  local_a0 = coder1;
  if (((uVar2 == 4) && (coder1[3].codec == 0x303011b)) &&
     ((folder->numInStreams == 7 && (uVar1 == 4 && folder->numOutStreams == 4)))) {
    if (folder->bindPairs->inIndex == 5) {
      local_b8[0] = 1;
      local_b8[1] = 2;
      local_b8[2] = 0;
      uStack_60 = folder->unPackSize[1];
      local_58 = *folder->unPackSize;
      local_48[1] = p_Var15;
      local_48[2] = coder1;
LAB_00499cdc:
      p_Var15 = coder1 + 2;
    }
    else if (coder1->codec == 0) {
      if (p_Var15->codec == 0) goto LAB_00499cdc;
      if (coder1[2].codec != 0) goto LAB_00499f74;
    }
    else {
LAB_00499f74:
      if ((p_Var15->codec != 0) || (p_Var15 = coder1, coder1[2].codec != 0)) goto LAB_00499f88;
    }
    psVar8 = folder->unPackSize + 2;
    local_a8 = coder1 + 3;
    local_a0 = p_Var15;
LAB_00499d3a:
    zip->main_stream_bytes_remaining = *psVar8;
    iVar14 = seek_pack(a);
    if (iVar14 < 0) {
LAB_00499f64:
      bVar5 = false;
    }
    else {
      zip->pack_stream_bytes_unconsumed = zip->pack_stream_inbytes_remaining;
      read_consume(a);
      lVar11 = 0;
      local_c0 = a;
      do {
        p_Var15 = local_48[lVar11];
        iVar14 = seek_pack(a);
        a = local_c0;
        if (iVar14 < 0) {
          free(local_d8[0]);
          free(local_d8[1]);
          free(local_d8[2]);
          header = iVar14;
LAB_00499e04:
          bVar5 = false;
          a = local_c0;
        }
        else {
          uVar7 = (&local_68)[lVar11];
          if (uVar7 == 0xffffffffffffffff) {
            uVar7 = zip->pack_stream_inbytes_remaining;
          }
          zip->folder_outbytes_remaining = uVar7;
          iVar14 = init_decompression(local_c0,zip,p_Var15,(_7z_coder *)0x0);
          if (iVar14 == 0) {
            local_98 = malloc(zip->folder_outbytes_remaining);
            local_d8[lVar11] = local_98;
            if (local_98 == (void *)0x0) {
              free(local_d8[0]);
              free(local_d8[1]);
              free(local_d8[2]);
              bVar5 = false;
              archive_set_error(&a->archive,0xc,"No memory for 7-Zip decompression");
              header = -0x1e;
            }
            else {
              while (zip->pack_stream_inbytes_remaining != 0) {
                sVar9 = extract_pack_stream(a,0);
                if (sVar9 < 0) {
                  free(local_d8[0]);
                  free(local_d8[1]);
                  free(local_d8[2]);
                  header = (int)sVar9;
                  goto LAB_00499dd9;
                }
                __n = get_uncompressed_data(a,&local_90,zip->uncompressed_buffer_bytes_remaining,0);
                if ((long)__n < 0) {
                  free(local_d8[0]);
                  free(local_d8[1]);
                  free(local_d8[2]);
                  header = (int)__n;
                  goto LAB_00499e04;
                }
                sVar4 = local_88[lVar11];
                memcpy((void *)((long)local_98 + sVar4),local_90,__n);
                a = local_c0;
                local_88[lVar11] = __n + sVar4;
                if (zip->pack_stream_bytes_unconsumed != 0) {
                  read_consume(local_c0);
                }
              }
              bVar5 = true;
            }
          }
          else {
            free(local_d8[0]);
            free(local_d8[1]);
            free(local_d8[2]);
            header = -0x1e;
LAB_00499dd9:
            bVar5 = false;
          }
        }
        iVar14 = header;
        if (!bVar5) goto LAB_00499f64;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 3);
      lVar11 = 0;
      do {
        iVar6 = local_b8[lVar11];
        zip->sub_stream_buff[lVar11] = (uchar *)local_d8[iVar6];
        sVar4 = local_88[iVar6];
        zip->sub_stream_size[lVar11] = sVar4;
        zip->sub_stream_bytes_remaining[lVar11] = sVar4;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 3);
      if (zip->tmp_stream_buff == (uchar *)0x0) {
        zip->tmp_stream_buff_size = 0x8000;
        puVar10 = (uchar *)malloc(0x8000);
        zip->tmp_stream_buff = puVar10;
        if (puVar10 == (uchar *)0x0) {
          pcVar16 = "No memory for 7-Zip decompression";
          iVar14 = 0xc;
          goto LAB_00499f99;
        }
      }
      zip->odd_bcj_size = 0;
      zip->bcj2_outPos = 0;
      zip->tmp_stream_bytes_avail = 0;
      zip->tmp_stream_bytes_remaining = 0;
      zip->pack_stream_remaining = 1;
      zip->pack_stream_index = folder->packIndex;
      uVar7 = folder_uncompressed_size(folder);
      zip->folder_outbytes_remaining = uVar7;
      zip->uncompressed_buffer_bytes_remaining = 0;
      bVar5 = true;
    }
  }
  else {
    if (((uVar2 == 2) && (uVar1 == 4 && coder2->codec == 0x303011b)) &&
       ((folder->numInStreams == 5 && (folder->numOutStreams == 2)))) {
      psVar8 = folder->unPackSize;
      goto LAB_00499d3a;
    }
LAB_00499f88:
    pcVar16 = "Unsupported form of BCJ2 streams";
    iVar14 = -1;
LAB_00499f99:
    bVar5 = false;
    archive_set_error(&a->archive,iVar14,pcVar16);
    iVar14 = -0x1e;
  }
  coder2 = local_a8;
  coder1 = local_a0;
  if (!bVar5) {
    return iVar14;
  }
LAB_00499fb3:
  iVar6 = init_decompression(a,zip,coder1,coder2);
  iVar14 = -0x1e;
  if (iVar6 == 0) {
    iVar14 = 0;
  }
  return iVar14;
}

Assistant:

static int
setup_decode_folder(struct archive_read *a, struct _7z_folder *folder,
    int header)
{
	struct _7zip *zip = (struct _7zip *)a->format->data;
	const struct _7z_coder *coder1, *coder2;
	const char *cname = (header)?"archive header":"file content";
	unsigned i;
	int r, found_bcj2 = 0;

	/*
	 * Release the memory which the previous folder used for BCJ2.
	 */
	for (i = 0; i < 3; i++) {
		if (zip->sub_stream_buff[i] != NULL)
			free(zip->sub_stream_buff[i]);
		zip->sub_stream_buff[i] = NULL;
	}

	/*
	 * Initialize a stream reader.
	 */
	zip->pack_stream_remaining = (unsigned)folder->numPackedStreams;
	zip->pack_stream_index = (unsigned)folder->packIndex;
	zip->folder_outbytes_remaining = folder_uncompressed_size(folder);
	zip->uncompressed_buffer_bytes_remaining = 0;

	/*
	 * Check coder types.
	 */
	for (i = 0; i < folder->numCoders; i++) {
		switch(folder->coders[i].codec) {
			case _7Z_CRYPTO_MAIN_ZIP:
			case _7Z_CRYPTO_RAR_29:
			case _7Z_CRYPTO_AES_256_SHA_256: {
				/* For entry that is associated with this folder, mark
				   it as encrypted (data+metadata). */
				zip->has_encrypted_entries = 1;
				if (a->entry) {
					archive_entry_set_is_data_encrypted(a->entry, 1);
					archive_entry_set_is_metadata_encrypted(a->entry, 1);
				}
				archive_set_error(&(a->archive),
					ARCHIVE_ERRNO_MISC,
					"The %s is encrypted, "
					"but currently not supported", cname);
				return (ARCHIVE_FATAL);
			}
			case _7Z_X86_BCJ2: {
				found_bcj2++;
				break;
			}
		}
	}
	/* Now that we've checked for encryption, if there were still no
	 * encrypted entries found we can say for sure that there are none.
	 */
	if (zip->has_encrypted_entries == ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW) {
		zip->has_encrypted_entries = 0;
	}

	if ((folder->numCoders > 2 && !found_bcj2) || found_bcj2 > 1) {
		archive_set_error(&(a->archive),
		    ARCHIVE_ERRNO_MISC,
		    "The %s is encoded with many filters, "
		    "but currently not supported", cname);
		return (ARCHIVE_FATAL);
	}
	coder1 = &(folder->coders[0]);
	if (folder->numCoders == 2)
		coder2 = &(folder->coders[1]);
	else
		coder2 = NULL;

	if (found_bcj2) {
		/*
		 * Preparation to decode BCJ2.
		 * Decoding BCJ2 requires four sources. Those are at least,
		 * as far as I know, two types of the storage form.
		 */
		const struct _7z_coder *fc = folder->coders;
		static const struct _7z_coder coder_copy = {0, 1, 1, 0, NULL};
		const struct _7z_coder *scoder[3] =
			{&coder_copy, &coder_copy, &coder_copy};
		const void *buff;
		ssize_t bytes;
		unsigned char *b[3] = {NULL, NULL, NULL};
		uint64_t sunpack[3] ={-1, -1, -1};
		size_t s[3] = {0, 0, 0};
		int idx[3] = {0, 1, 2};

		if (folder->numCoders == 4 && fc[3].codec == _7Z_X86_BCJ2 &&
		    folder->numInStreams == 7 && folder->numOutStreams == 4 &&
		    zip->pack_stream_remaining == 4) {
			/* Source type 1 made by 7zr or 7z with -m options. */
			if (folder->bindPairs[0].inIndex == 5) {
				/* The form made by 7zr */
				idx[0] = 1; idx[1] = 2; idx[2] = 0;
				scoder[1] = &(fc[1]);
				scoder[2] = &(fc[0]);
				sunpack[1] = folder->unPackSize[1];
				sunpack[2] = folder->unPackSize[0];
				coder1 = &(fc[2]);
			} else {
				/*
				 * NOTE: Some patterns do not work.
				 * work:
				 *  7z a -m0=BCJ2 -m1=COPY -m2=COPY
				 *       -m3=(any)
				 *  7z a -m0=BCJ2 -m1=COPY -m2=(any)
				 *       -m3=COPY
				 *  7z a -m0=BCJ2 -m1=(any) -m2=COPY
				 *       -m3=COPY
				 * not work:
				 *  other patterns.
				 *
				 * We have to handle this like `pipe' or
				 * our libarchive7s filter frame work,
				 * decoding the BCJ2 main stream sequentially,
				 * m3 -> m2 -> m1 -> BCJ2.
				 *
				 */
				if (fc[0].codec == _7Z_COPY &&
				    fc[1].codec == _7Z_COPY)
					coder1 = &(folder->coders[2]);
				else if (fc[0].codec == _7Z_COPY &&
				    fc[2].codec == _7Z_COPY)
					coder1 = &(folder->coders[1]);
				else if (fc[1].codec == _7Z_COPY &&
				    fc[2].codec == _7Z_COPY)
					coder1 = &(folder->coders[0]);
				else {
					archive_set_error(&(a->archive),
					    ARCHIVE_ERRNO_MISC,
					    "Unsupported form of "
					    "BCJ2 streams");
					return (ARCHIVE_FATAL);
				}
			}
			coder2 = &(fc[3]);
			zip->main_stream_bytes_remaining =
				(size_t)folder->unPackSize[2];
		} else if (coder2 != NULL && coder2->codec == _7Z_X86_BCJ2 &&
		    zip->pack_stream_remaining == 4 &&
		    folder->numInStreams == 5 && folder->numOutStreams == 2) {
			/* Source type 0 made by 7z */
			zip->main_stream_bytes_remaining =
				(size_t)folder->unPackSize[0];
		} else {
			/* We got an unexpected form. */
			archive_set_error(&(a->archive),
			    ARCHIVE_ERRNO_MISC,
			    "Unsupported form of BCJ2 streams");
			return (ARCHIVE_FATAL);
		}

		/* Skip the main stream at this time. */
		if ((r = seek_pack(a)) < 0)
			return (r);
		zip->pack_stream_bytes_unconsumed =
		    (size_t)zip->pack_stream_inbytes_remaining;
		read_consume(a);

		/* Read following three sub streams. */
		for (i = 0; i < 3; i++) {
			const struct _7z_coder *coder = scoder[i];

			if ((r = seek_pack(a)) < 0) {
				free(b[0]); free(b[1]); free(b[2]);
				return (r);
			}

			if (sunpack[i] == (uint64_t)-1)
				zip->folder_outbytes_remaining =
				    zip->pack_stream_inbytes_remaining;
			else
				zip->folder_outbytes_remaining = sunpack[i];

			r = init_decompression(a, zip, coder, NULL);
			if (r != ARCHIVE_OK) {
				free(b[0]); free(b[1]); free(b[2]);
				return (ARCHIVE_FATAL);
			}

			/* Allocate memory for the decoded data of a sub
			 * stream. */
			b[i] = malloc((size_t)zip->folder_outbytes_remaining);
			if (b[i] == NULL) {
				free(b[0]); free(b[1]); free(b[2]);
				archive_set_error(&a->archive, ENOMEM,
				    "No memory for 7-Zip decompression");
				return (ARCHIVE_FATAL);
			}

			/* Extract a sub stream. */
			while (zip->pack_stream_inbytes_remaining > 0) {
				r = (int)extract_pack_stream(a, 0);
				if (r < 0) {
					free(b[0]); free(b[1]); free(b[2]);
					return (r);
				}
				bytes = get_uncompressed_data(a, &buff,
				    zip->uncompressed_buffer_bytes_remaining,
				    0);
				if (bytes < 0) {
					free(b[0]); free(b[1]); free(b[2]);
					return ((int)bytes);
				}
				memcpy(b[i]+s[i], buff, bytes);
				s[i] += bytes;
				if (zip->pack_stream_bytes_unconsumed)
					read_consume(a);
			}
		}

		/* Set the sub streams to the right place. */
		for (i = 0; i < 3; i++) {
			zip->sub_stream_buff[i] = b[idx[i]];
			zip->sub_stream_size[i] = s[idx[i]];
			zip->sub_stream_bytes_remaining[i] = s[idx[i]];
		}

		/* Allocate memory used for decoded main stream bytes. */
		if (zip->tmp_stream_buff == NULL) {
			zip->tmp_stream_buff_size = 32 * 1024;
			zip->tmp_stream_buff =
			    malloc(zip->tmp_stream_buff_size);
			if (zip->tmp_stream_buff == NULL) {
				archive_set_error(&a->archive, ENOMEM,
				    "No memory for 7-Zip decompression");
				return (ARCHIVE_FATAL);
			}
		}
		zip->tmp_stream_bytes_avail = 0;
		zip->tmp_stream_bytes_remaining = 0;
		zip->odd_bcj_size = 0;
		zip->bcj2_outPos = 0;

		/*
		 * Reset a stream reader in order to read the main stream
		 * of BCJ2.
		 */
		zip->pack_stream_remaining = 1;
		zip->pack_stream_index = (unsigned)folder->packIndex;
		zip->folder_outbytes_remaining =
		    folder_uncompressed_size(folder);
		zip->uncompressed_buffer_bytes_remaining = 0;
	}

	/*
	 * Initialize the decompressor for the new folder's pack streams.
	 */
	r = init_decompression(a, zip, coder1, coder2);
	if (r != ARCHIVE_OK)
		return (ARCHIVE_FATAL);
	return (ARCHIVE_OK);
}